

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finite.h
# Opt level: O0

void __thiscall Finite::Finite(Finite *this,BigInteger *n)

{
  bool bVar1;
  BigInteger *in_stack_fffffffffffffe78;
  BigInteger *pBVar2;
  BigInteger *in_stack_fffffffffffffe80;
  BigInteger *pBVar3;
  longlong in_stack_fffffffffffffe88;
  BigInteger *in_stack_fffffffffffffe90;
  BigInteger *this_00;
  BigInteger *a;
  BigInteger *in_stack_fffffffffffffed8;
  BigInteger *in_stack_fffffffffffffee0;
  BigInteger local_100;
  BigInteger local_e0;
  BigInteger local_c0 [2];
  BigInteger local_80 [4];
  
  BigInteger::BigInteger(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  bVar1 = operator>=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  if (bVar1) {
    BigInteger::operator%=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  BigInteger::BigInteger(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  bVar1 = ::operator<(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  BigInteger::~BigInteger((BigInteger *)0x11afba);
  if (bVar1) {
    this_00 = &local_100;
    BigInteger::BigInteger(this_00,in_stack_fffffffffffffe88);
    a = &local_e0;
    ::operator-(a,this_00);
    pBVar2 = (BigInteger *)&stack0xfffffffffffffee0;
    BigInteger::BigInteger(this_00,in_stack_fffffffffffffe88);
    pBVar3 = local_c0;
    ::operator-(a,this_00);
    operator%(pBVar3,pBVar2);
    pBVar2 = (BigInteger *)&stack0xfffffffffffffec0;
    BigInteger::BigInteger(this_00,in_stack_fffffffffffffe88);
    pBVar3 = local_80;
    ::operator+(a,this_00);
    ::operator-(a,this_00);
    BigInteger::operator=(pBVar3,pBVar2);
    BigInteger::~BigInteger((BigInteger *)0x11b0b1);
    BigInteger::~BigInteger((BigInteger *)0x11b0be);
    BigInteger::~BigInteger((BigInteger *)0x11b0c8);
    BigInteger::~BigInteger((BigInteger *)0x11b0d5);
    BigInteger::~BigInteger((BigInteger *)0x11b0e2);
    BigInteger::~BigInteger((BigInteger *)0x11b0ec);
    BigInteger::~BigInteger((BigInteger *)0x11b0f9);
    BigInteger::~BigInteger((BigInteger *)0x11b106);
  }
  return;
}

Assistant:

Finite(const BigInteger &n): val(n)
    {
        if(val >= _FINITE_ORDER)
            val %= _FINITE_ORDER;
        if(val < 0)
            val = _FINITE_ORDER - ((0ll - val - 1) % _FINITE_ORDER + 1);
    }